

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void PredictorInverseTransform_C
               (VP8LTransform *transform,int y_start,int y_end,uint32_t *in,uint32_t *out)

{
  uint32_t size;
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  long in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  int x_end;
  VP8LPredictorAddSubFunc pred_func;
  int x;
  uint32_t *pred_mode_src;
  uint32_t *pred_mode_base;
  int tiles_per_row;
  int mask;
  int tile_width;
  int y;
  int width;
  uint32_t *in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffffa4;
  VP8LPredictorAddSubFunc in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar4;
  uint *local_48;
  uint *local_40;
  uint local_28;
  long local_20;
  long local_18;
  uint local_c;
  
  size = *(uint32_t *)(in_RDI + 8);
  local_20 = in_R8;
  local_18 = in_RCX;
  local_c = in_ESI;
  if (in_ESI == 0) {
    PredictorAdd0_C((uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (uint32_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                    in_stack_ffffffffffffff98);
    PredictorAdd1_C((uint32_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (uint32_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                    in_stack_ffffffffffffff98);
    local_18 = in_RCX + (long)(int)size * 4;
    local_20 = in_R8 + (long)(int)size * 4;
    local_c = 1;
  }
  local_28 = local_c;
  iVar1 = 1 << ((byte)*(undefined4 *)(in_RDI + 4) & 0x1f);
  uVar2 = iVar1 - 1;
  uVar3 = VP8LSubSampleSize(size,*(uint32_t *)(in_RDI + 4));
  local_40 = (uint *)(*(long *)(in_RDI + 0x10) +
                     (long)(int)(((int)local_c >> ((byte)*(undefined4 *)(in_RDI + 4) & 0x1f)) *
                                uVar3) * 4);
  while ((int)local_28 < in_EDX) {
    local_48 = local_40;
    uVar4 = 1;
    PredictorAdd2_C((uint32_t *)CONCAT44(1,in_stack_ffffffffffffffb0),
                    (uint32_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                    in_stack_ffffffffffffff98);
    while ((int)uVar4 < (int)size) {
      in_stack_ffffffffffffffa8 = VP8LPredictorsAdd[*local_48 >> 8 & 0xf];
      in_stack_ffffffffffffffa4 = (uVar4 & (uVar2 ^ 0xffffffff)) + iVar1;
      if ((int)size < (int)in_stack_ffffffffffffffa4) {
        in_stack_ffffffffffffffa4 = size;
      }
      (*in_stack_ffffffffffffffa8)
                ((uint32_t *)(local_18 + (long)(int)uVar4 * 4),
                 (uint32_t *)(local_20 + (long)(int)uVar4 * 4 + (long)(int)size * -4),
                 in_stack_ffffffffffffffa4 - uVar4,(uint32_t *)(local_20 + (long)(int)uVar4 * 4));
      uVar4 = in_stack_ffffffffffffffa4;
      local_48 = local_48 + 1;
    }
    local_18 = local_18 + (long)(int)size * 4;
    local_20 = local_20 + (long)(int)size * 4;
    local_28 = local_28 + 1;
    if ((local_28 & uVar2) == 0) {
      local_40 = local_40 + (int)uVar3;
    }
  }
  return;
}

Assistant:

static void PredictorInverseTransform_C(const VP8LTransform* const transform,
                                        int y_start, int y_end,
                                        const uint32_t* in, uint32_t* out) {
  const int width = transform->xsize;
  if (y_start == 0) {  // First Row follows the L (mode=1) mode.
    PredictorAdd0_C(in, NULL, 1, out);
    PredictorAdd1_C(in + 1, NULL, width - 1, out + 1);
    in += width;
    out += width;
    ++y_start;
  }

  {
    int y = y_start;
    const int tile_width = 1 << transform->bits;
    const int mask = tile_width - 1;
    const int tiles_per_row = VP8LSubSampleSize(width, transform->bits);
    const uint32_t* pred_mode_base =
        transform->data + (y >> transform->bits) * tiles_per_row;

    while (y < y_end) {
      const uint32_t* pred_mode_src = pred_mode_base;
      int x = 1;
      // First pixel follows the T (mode=2) mode.
      PredictorAdd2_C(in, out - width, 1, out);
      // .. the rest:
      while (x < width) {
        const VP8LPredictorAddSubFunc pred_func =
            VP8LPredictorsAdd[((*pred_mode_src++) >> 8) & 0xf];
        int x_end = (x & ~mask) + tile_width;
        if (x_end > width) x_end = width;
        pred_func(in + x, out + x - width, x_end - x, out + x);
        x = x_end;
      }
      in += width;
      out += width;
      ++y;
      if ((y & mask) == 0) {   // Use the same mask, since tiles are squares.
        pred_mode_base += tiles_per_row;
      }
    }
  }
}